

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cpp
# Opt level: O2

int duckdb_brotli::BrotliEncoderCompressStream
              (BrotliEncoderStateInternal *s,BrotliEncoderOperation op,size_t *available_in,
              uint8_t **next_in,size_t *available_out,uint8_t **next_out,size_t *total_out)

{
  MemoryManager *m;
  anon_union_16_2_c961180f_for_tiny_buf_ *__dest;
  undefined8 uVar1;
  uint8_t uVar2;
  int iVar3;
  BrotliEncoderStreamState BVar4;
  ulong uVar5;
  BrotliOnePassArena *pBVar6;
  BrotliTwoPassArena *pBVar7;
  uint32_t *puVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  int *table;
  byte bVar11;
  uint uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  uint64_t uVar18;
  size_t sVar19;
  uint uVar20;
  undefined8 *puVar21;
  ulong uVar22;
  ulong uVar23;
  uint8_t *puVar24;
  uint32_t uVar25;
  uint32_t uVar26;
  bool bVar27;
  uint16_t uVar28;
  size_t sVar29;
  bool bVar30;
  uint uVar31;
  bool bVar32;
  byte bVar33;
  uint32_t *local_80;
  uint8_t *local_78;
  uint32_t *local_70;
  uint8_t *local_68;
  size_t storage_ix;
  uint local_40;
  BrotliEncoderStreamState local_3c;
  size_t local_38;
  byte bVar12;
  
  bVar33 = 0;
  m = &s->memory_manager_;
  if (s->is_initialized_ == 0) {
    s->last_bytes_ = 0;
    s->last_bytes_bits_ = '\0';
    s->flint_ = -2;
    s->remaining_metadata_bytes_ = 0xffffffff;
    uVar20 = (s->params).quality;
    uVar13 = 0;
    if (0 < (int)uVar20) {
      uVar13 = uVar20;
    }
    uVar31 = 0xb;
    if ((int)uVar13 < 0xb) {
      uVar31 = uVar13;
    }
    (s->params).quality = uVar31;
    if ((int)uVar20 < 3) {
      (s->params).large_window = 0;
    }
    uVar13 = (s->params).lgwin;
    if ((int)uVar13 < 10) {
      uVar31 = 10;
LAB_01e1d9cf:
      uVar13 = uVar31;
      (s->params).lgwin = uVar13;
    }
    else {
      uVar31 = 0x1e;
      if ((s->params).large_window == 0) {
        uVar31 = 0x18;
      }
      if (uVar31 < uVar13) goto LAB_01e1d9cf;
    }
    if ((int)uVar20 < 2) {
LAB_01e1d9e9:
      (s->params).lgblock = uVar13;
LAB_01e1d9ec:
      uVar13 = 0;
      uVar20 = 0;
    }
    else {
      if (uVar20 < 4) {
        uVar13 = 0xe;
        goto LAB_01e1d9e9;
      }
      uVar31 = (s->params).lgblock;
      if (uVar31 == 0) {
        uVar14 = 0x10;
        if (((8 < uVar20) && (0x10 < uVar13)) && (uVar14 = uVar13, 0x11 < uVar13)) {
          uVar14 = 0x12;
        }
      }
      else {
        if ((int)uVar31 < 0x11) {
          uVar31 = 0x10;
        }
        uVar14 = 0x18;
        if ((int)uVar31 < 0x18) {
          uVar14 = uVar31;
        }
      }
      (s->params).lgblock = uVar14;
      if ((s->params).mode == BROTLI_MODE_FONT) {
        uVar20 = 1;
        uVar13 = 0xc;
      }
      else {
        uVar20 = (s->params).dist.distance_postfix_bits;
        uVar13 = (s->params).dist.num_direct_distance_codes;
      }
      if ((0x78 < uVar13 || 3 < uVar20) ||
         ((uVar13 >> ((byte)uVar20 & 0x1f) & 0xf) << ((byte)uVar20 & 0x1f) != uVar13))
      goto LAB_01e1d9ec;
    }
    BrotliInitDistanceParams(&(s->params).dist,uVar20,uVar13,(s->params).large_window);
    uVar16 = (s->params).stream_offset;
    if (uVar16 != 0) {
      s->flint_ = '\x02';
      s->dist_cache_[0] = -0x10;
      s->dist_cache_[1] = -0x10;
      s->dist_cache_[2] = -0x10;
      s->dist_cache_[3] = -0x10;
      uVar1 = *(undefined8 *)(s->dist_cache_ + 2);
      *(undefined8 *)s->saved_dist_cache_ = *(undefined8 *)s->dist_cache_;
      *(undefined8 *)(s->saved_dist_cache_ + 2) = uVar1;
    }
    uVar20 = (s->params).quality;
    uVar13 = (s->params).lgwin;
    iVar3 = (s->params).lgblock;
    bVar11 = (byte)iVar3;
    bVar12 = bVar11;
    if (iVar3 < (int)uVar13) {
      bVar12 = (byte)uVar13;
    }
    uVar26 = 1 << (bVar12 + 1 & 0x1f);
    uVar25 = 1 << (bVar11 & 0x1f);
    uVar31 = 0x12;
    if (0x12 < (int)uVar13) {
      uVar31 = uVar13;
    }
    if (1 < uVar20) {
      uVar31 = uVar13;
    }
    (s->ringbuffer_).size_ = uVar26;
    (s->ringbuffer_).mask_ = uVar26 - 1;
    (s->ringbuffer_).tail_size_ = uVar25;
    (s->ringbuffer_).total_size_ = uVar26 + uVar25;
    if (uVar16 == 0) {
      if ((s->params).large_window == 0) {
        if (uVar31 == 0x10) {
          uVar2 = '\x01';
          uVar28 = 0;
        }
        else if (uVar31 == 0x11) {
          uVar2 = '\a';
          uVar28 = 1;
        }
        else if ((int)uVar31 < 0x12) {
          uVar28 = (short)uVar31 * 0x10 - 0x7f;
          uVar2 = '\a';
        }
        else {
          uVar28 = (short)uVar31 * 2 - 0x21;
          uVar2 = '\x04';
        }
      }
      else {
        uVar28 = (ushort)((uVar31 & 0x3f) << 8) | 0x11;
        uVar2 = '\x0e';
      }
      s->last_bytes_ = uVar28;
      s->last_bytes_bits_ = uVar2;
    }
    else {
      uVar5 = (1L << ((byte)uVar31 & 0x3f)) - 0x10;
      if (uVar16 < uVar5) {
        uVar5 = uVar16;
      }
      (s->params).stream_offset = uVar5;
    }
    if (uVar20 == 1) {
      pBVar7 = (BrotliTwoPassArena *)BrotliAllocate(m,0x1dc8);
      s->two_pass_arena_ = pBVar7;
    }
    else if (uVar20 == 0) {
      pBVar6 = (BrotliOnePassArena *)BrotliAllocate(m,0x1fd0);
      s->one_pass_arena_ = pBVar6;
      puVar21 = &InitCommandPrefixCodes(duckdb_brotli::BrotliOnePassArena*)::kDefaultCommandDepths;
      puVar10 = pBVar6->cmd_depth;
      for (lVar15 = 0x10; lVar15 != 0; lVar15 = lVar15 + -1) {
        *(undefined8 *)puVar10 = *puVar21;
        puVar21 = puVar21 + (ulong)bVar33 * -2 + 1;
        puVar10 = puVar10 + (ulong)bVar33 * -0x10 + 8;
      }
      switchD_01939fa4::default
                (pBVar6->cmd_bits,
                 InitCommandPrefixCodes(duckdb_brotli::BrotliOnePassArena*)::kDefaultCommandBits,
                 0x100);
      pBVar6->cmd_code[0] = 0xff;
      pBVar6->cmd_code[1] = 'w';
      pBVar6->cmd_code[2] = 0xd5;
      pBVar6->cmd_code[3] = 0xbf;
      pBVar6->cmd_code[4] = 0xe7;
      pBVar6->cmd_code[5] = 0xde;
      pBVar6->cmd_code[6] = 0xea;
      pBVar6->cmd_code[7] = 0x9e;
      pBVar6->cmd_code[8] = 'Q';
      pBVar6->cmd_code[9] = ']';
      pBVar6->cmd_code[10] = 0xde;
      pBVar6->cmd_code[0xb] = 0xc6;
      pBVar6->cmd_code[0xc] = 'p';
      pBVar6->cmd_code[0xd] = 'W';
      pBVar6->cmd_code[0xe] = 0xbc;
      pBVar6->cmd_code[0xf] = 'X';
      pBVar6->cmd_code[0x10] = 'X';
      pBVar6->cmd_code[0x11] = 'X';
      pBVar6->cmd_code[0x12] = 0xd8;
      pBVar6->cmd_code[0x13] = 0xd8;
      pBVar6->cmd_code[0x14] = 'X';
      pBVar6->cmd_code[0x15] = 0xd5;
      pBVar6->cmd_code[0x16] = 0xcb;
      pBVar6->cmd_code[0x17] = 0x8c;
      pBVar6->cmd_code[0x18] = 0xea;
      pBVar6->cmd_code[0x19] = 0xe0;
      pBVar6->cmd_code[0x1a] = 0xc3;
      pBVar6->cmd_code[0x1b] = 0x87;
      pBVar6->cmd_code[0x1c] = '\x1f';
      pBVar6->cmd_code[0x1d] = 0x83;
      pBVar6->cmd_code[0x1e] = 0xc1;
      pBVar6->cmd_code[0x1f] = '`';
      pBVar6->cmd_code[0x20] = '\x1c';
      pBVar6->cmd_code[0x21] = 'g';
      pBVar6->cmd_code[0x22] = 0xb2;
      pBVar6->cmd_code[0x23] = 0xaa;
      pBVar6->cmd_code[0x24] = '\x06';
      pBVar6->cmd_code[0x25] = 0x83;
      pBVar6->cmd_code[0x26] = 0xc1;
      pBVar6->cmd_code[0x27] = '`';
      pBVar6->cmd_code[0x28] = '0';
      pBVar6->cmd_code[0x29] = '\x18';
      pBVar6->cmd_code[0x2a] = 0xcc;
      pBVar6->cmd_code[0x2b] = 0xa1;
      pBVar6->cmd_code[0x2c] = 0xce;
      pBVar6->cmd_code[0x2d] = 0x88;
      pBVar6->cmd_code[0x2e] = 'T';
      pBVar6->cmd_code[0x2f] = 0x94;
      pBVar6->cmd_code[0x29] = '\x18';
      pBVar6->cmd_code[0x2a] = 0xcc;
      pBVar6->cmd_code[0x2b] = 0xa1;
      pBVar6->cmd_code[0x2c] = 0xce;
      pBVar6->cmd_code[0x2d] = 0x88;
      pBVar6->cmd_code[0x2e] = 'T';
      pBVar6->cmd_code[0x2f] = 0x94;
      pBVar6->cmd_code[0x30] = 'F';
      pBVar6->cmd_code[0x31] = 0xe1;
      pBVar6->cmd_code[0x32] = 0xb0;
      pBVar6->cmd_code[0x33] = 0xd0;
      pBVar6->cmd_code[0x34] = 'N';
      pBVar6->cmd_code[0x35] = 0xb2;
      pBVar6->cmd_code[0x36] = 0xf7;
      pBVar6->cmd_code[0x37] = '\x04';
      pBVar6->cmd_code[0x38] = '\0';
      pBVar6->cmd_code_numbits = 0x1c0;
    }
    s->is_initialized_ = 1;
  }
  if ((ulong)s->remaining_metadata_bytes_ != 0xffffffff) {
    if (op != BROTLI_OPERATION_EMIT_METADATA) {
      return 0;
    }
    if (*available_in != (ulong)s->remaining_metadata_bytes_) {
      return 0;
    }
LAB_01e1dbc0:
    UpdateSizeHint(s,0);
    if (0x1000000 < *available_in) {
      return 0;
    }
    if (s->stream_state_ == BROTLI_STREAM_PROCESSING) {
      s->remaining_metadata_bytes_ = (uint32_t)*available_in;
      s->stream_state_ = BROTLI_STREAM_METADATA_HEAD;
    }
    else if (1 < s->stream_state_ - BROTLI_STREAM_METADATA_HEAD) {
      return 0;
    }
    __dest = &s->tiny_buf_;
    do {
      while( true ) {
        while( true ) {
          do {
            iVar3 = InjectFlushOrPushOutput(s,available_out,next_out,total_out);
          } while (iVar3 != 0);
          if (s->available_out_ != 0) {
            return 1;
          }
          if (s->input_pos_ == s->last_flush_pos_) break;
          iVar3 = EncodeData(s,0,1,&s->available_out_,&s->next_out_);
          if (iVar3 == 0) {
            return 0;
          }
        }
        if (s->stream_state_ == BROTLI_STREAM_METADATA_HEAD) break;
        uVar20 = s->remaining_metadata_bytes_;
        uVar16 = (ulong)uVar20;
        if (uVar16 == 0) {
          s->remaining_metadata_bytes_ = 0xffffffff;
          s->stream_state_ = BROTLI_STREAM_PROCESSING;
          return 1;
        }
        uVar5 = *available_out;
        if (uVar5 == 0) {
          sVar19 = (size_t)uVar20;
          if (0xf < uVar20) {
            sVar19 = 0x10;
          }
          s->next_out_ = (uint8_t *)__dest;
          switchD_01939fa4::default(__dest,*next_in,sVar19);
          *next_in = *next_in + sVar19;
          *available_in = *available_in - sVar19;
          s->total_in_ = s->total_in_ + sVar19;
          s->remaining_metadata_bytes_ = s->remaining_metadata_bytes_ - (int)sVar19;
          s->available_out_ = sVar19;
        }
        else {
          if (uVar16 < uVar5) {
            uVar5 = uVar16;
          }
          switchD_01939fa4::default(*next_out,*next_in,uVar5);
          *next_in = *next_in + uVar5;
          *available_in = *available_in - uVar5;
          s->total_in_ = s->total_in_ + uVar5;
          s->remaining_metadata_bytes_ = s->remaining_metadata_bytes_ - (int)uVar5;
          *next_out = *next_out + uVar5;
          *available_out = *available_out - uVar5;
        }
      }
      s->next_out_ = (uint8_t *)__dest;
      uVar20 = s->remaining_metadata_bytes_;
      uVar22 = (ulong)uVar20;
      bVar33 = s->last_bytes_bits_;
      uVar17 = (ulong)bVar33;
      *(uint16_t *)&s->tiny_buf_ = s->last_bytes_;
      s->last_bytes_ = 0;
      s->last_bytes_bits_ = '\0';
      *(ulong *)((long)&s->tiny_buf_ + (ulong)(bVar33 >> 3)) = (ulong)(s->tiny_buf_).u8[bVar33 >> 3]
      ;
      uVar5 = uVar17 + 1 >> 3;
      uVar23 = (ulong)(bVar33 + 3 >> 3);
      uVar16 = uVar17 + 4;
      *(ulong *)((long)&s->tiny_buf_ + uVar5) =
           3L << ((byte)(uVar17 + 1) & 7) | (ulong)(s->tiny_buf_).u8[uVar5];
      *(ulong *)((long)&s->tiny_buf_ + uVar23) = (ulong)(s->tiny_buf_).u8[uVar23];
      if (uVar22 == 1) {
LAB_01e1df0e:
        uVar5 = uVar17 + (ulong)uVar20 * 8;
        *(ulong *)((long)__dest + (uVar16 >> 3)) =
             (ulong)uVar20 << ((byte)uVar16 & 7) | (ulong)__dest->u8[uVar16 >> 3];
        uVar16 = uVar17 + 6 >> 3;
        *(ulong *)((long)__dest + uVar16) =
             uVar22 - 1 << ((byte)(uVar17 + 6) & 7) | (ulong)__dest->u8[uVar16];
      }
      else {
        if (uVar20 != 0) {
          uVar13 = 0x1f;
          if (uVar20 - 1 != 0) {
            for (; uVar20 - 1 >> uVar13 == 0; uVar13 = uVar13 - 1) {
            }
          }
          uVar20 = (uVar13 ^ 0xffffffe0) + 0x28 >> 3;
          goto LAB_01e1df0e;
        }
        *(ulong *)((long)__dest + (uVar16 >> 3)) = (ulong)__dest->u8[uVar16 >> 3];
        uVar5 = uVar17;
      }
      s->available_out_ = uVar5 + 0xd >> 3;
      s->stream_state_ = BROTLI_STREAM_METADATA_BODY;
    } while( true );
  }
  if (op == BROTLI_OPERATION_EMIT_METADATA) goto LAB_01e1dbc0;
  if (s->stream_state_ - BROTLI_STREAM_METADATA_HEAD < 2) {
    return 0;
  }
  if ((s->stream_state_ != BROTLI_STREAM_PROCESSING) && (*available_in != 0)) {
    return 0;
  }
  uVar20 = (s->params).quality;
  if (1 < uVar20) {
    while( true ) {
      while( true ) {
        while( true ) {
          uVar5 = s->input_pos_ - s->last_processed_pos_;
          uVar22 = 1L << ((byte)(s->params).lgblock & 0x3f);
          uVar16 = uVar22 - uVar5;
          if (uVar22 < uVar5) {
            uVar16 = 0;
          }
          uVar22 = (ulong)s->flint_;
          uVar5 = uVar22;
          if (uVar16 < uVar22) {
            uVar5 = uVar16;
          }
          if ((long)uVar22 < 0) {
            uVar5 = uVar16;
          }
          if ((uVar5 == 0) || (uVar16 = *available_in, uVar16 == 0)) break;
          if (uVar5 < uVar16) {
            uVar16 = uVar5;
          }
          puVar10 = *next_in;
          uVar25 = (s->ringbuffer_).pos_;
          uVar20 = (uint)uVar16;
          if ((uVar25 == 0) && (uVar16 < (s->ringbuffer_).tail_size_)) {
            (s->ringbuffer_).pos_ = uVar20;
            puVar9 = (uint8_t *)BrotliAllocate(m,(ulong)(uVar20 + 2) + 7);
            puVar24 = (s->ringbuffer_).data_;
            if (puVar24 != (uint8_t *)0x0) {
              switchD_01939fa4::default(puVar9,puVar24,(ulong)((s->ringbuffer_).cur_size_ + 2) + 7);
              BrotliFree(m,(s->ringbuffer_).data_);
            }
            (s->ringbuffer_).data_ = puVar9;
            (s->ringbuffer_).cur_size_ = uVar20;
            (s->ringbuffer_).buffer_ = puVar9 + 2;
            puVar9[1] = '\0';
            (s->ringbuffer_).buffer_[-2] = '\0';
            for (lVar15 = 0; puVar24 = (s->ringbuffer_).buffer_, lVar15 != 7; lVar15 = lVar15 + 1) {
              puVar24[lVar15 + (ulong)(s->ringbuffer_).cur_size_] = '\0';
            }
            switchD_01939fa4::default(puVar24,puVar10,uVar16);
            uVar20 = (s->ringbuffer_).pos_;
          }
          else {
            uVar13 = (s->ringbuffer_).total_size_;
            if ((s->ringbuffer_).cur_size_ < uVar13) {
              puVar9 = (uint8_t *)BrotliAllocate(m,(ulong)(uVar13 + 2) + 7);
              puVar24 = (s->ringbuffer_).data_;
              if (puVar24 != (uint8_t *)0x0) {
                switchD_01939fa4::default
                          (puVar9,puVar24,(ulong)((s->ringbuffer_).cur_size_ + 2) + 7);
                BrotliFree(m,(s->ringbuffer_).data_);
              }
              (s->ringbuffer_).data_ = puVar9;
              (s->ringbuffer_).cur_size_ = uVar13;
              (s->ringbuffer_).buffer_ = puVar9 + 2;
              puVar9[1] = '\0';
              (s->ringbuffer_).buffer_[-2] = '\0';
              for (lVar15 = 0; puVar24 = (s->ringbuffer_).buffer_, lVar15 != 7; lVar15 = lVar15 + 1)
              {
                puVar24[lVar15 + (ulong)(s->ringbuffer_).cur_size_] = '\0';
              }
              puVar24[(s->ringbuffer_).size_ - 2] = '\0';
              (s->ringbuffer_).buffer_[(s->ringbuffer_).size_ - 1] = '\0';
              (s->ringbuffer_).buffer_[(s->ringbuffer_).size_] = 0xf1;
              uVar25 = (s->ringbuffer_).pos_;
            }
            uVar31 = uVar25 & (s->ringbuffer_).mask_;
            uVar22 = (ulong)uVar31;
            uVar5 = (ulong)(s->ringbuffer_).size_;
            uVar13 = (s->ringbuffer_).tail_size_;
            if (uVar31 < uVar13) {
              uVar17 = uVar13 - uVar22;
              if (uVar16 < uVar17) {
                uVar17 = uVar16;
              }
              switchD_01939fa4::default((s->ringbuffer_).buffer_ + uVar22 + uVar5,puVar10,uVar17);
              uVar5 = (ulong)(s->ringbuffer_).size_;
            }
            puVar24 = (s->ringbuffer_).buffer_ + uVar22;
            sVar19 = uVar16;
            if (uVar5 < uVar22 + uVar16) {
              uVar5 = (s->ringbuffer_).total_size_ - uVar22;
              if (uVar16 < uVar5) {
                uVar5 = uVar16;
              }
              switchD_01939fa4::default(puVar24,puVar10,uVar5);
              puVar24 = (s->ringbuffer_).buffer_;
              lVar15 = (s->ringbuffer_).size_ - uVar22;
              puVar10 = puVar10 + lVar15;
              sVar19 = uVar16 - lVar15;
            }
            switchD_01939fa4::default(puVar24,puVar10,sVar19);
            puVar10 = (s->ringbuffer_).buffer_;
            uVar13 = (s->ringbuffer_).pos_;
            puVar10[-2] = puVar10[(s->ringbuffer_).size_ - 2];
            puVar10 = (s->ringbuffer_).buffer_;
            puVar10[-1] = puVar10[(s->ringbuffer_).size_ - 1];
            uVar20 = (uVar20 & 0x7fffffff) + ((s->ringbuffer_).pos_ & 0x7fffffff) |
                     uVar13 & 0x80000000;
            (s->ringbuffer_).pos_ = uVar20;
          }
          s->input_pos_ = s->input_pos_ + uVar16;
          if (uVar20 <= (s->ringbuffer_).mask_) {
            puVar10 = (s->ringbuffer_).buffer_;
            puVar24 = puVar10 + (ulong)uVar20 + 3;
            puVar24[0] = '\0';
            puVar24[1] = '\0';
            puVar24[2] = '\0';
            puVar24[3] = '\0';
            puVar10 = puVar10 + uVar20;
            puVar10[0] = '\0';
            puVar10[1] = '\0';
            puVar10[2] = '\0';
            puVar10[3] = '\0';
          }
          *next_in = *next_in + uVar16;
          *available_in = *available_in - uVar16;
          s->total_in_ = s->total_in_ + uVar16;
          if ('\0' < s->flint_) {
            s->flint_ = s->flint_ - (char)uVar16;
          }
        }
        iVar3 = InjectFlushOrPushOutput(s,available_out,next_out,total_out);
        if (iVar3 == 0) break;
        if ((s->flint_ == -1) &&
           (CheckFlushComplete(s), s->stream_state_ == BROTLI_STREAM_PROCESSING)) {
          s->flint_ = -2;
        }
      }
      if (((s->available_out_ != 0) || (op == BROTLI_OPERATION_PROCESS && uVar5 != 0)) ||
         (s->stream_state_ != BROTLI_STREAM_PROCESSING)) break;
      sVar29 = *available_in;
      bVar32 = sVar29 == 0;
      bVar27 = op == BROTLI_OPERATION_FINISH && bVar32;
      bVar30 = op == BROTLI_OPERATION_FLUSH && bVar32;
      if ((op != BROTLI_OPERATION_FINISH || !bVar32) && (s->flint_ == '\0')) {
        s->flint_ = -1;
        bVar30 = true;
      }
      UpdateSizeHint(s,sVar29);
      iVar3 = EncodeData(s,(uint)bVar27,(uint)bVar30,&s->available_out_,&s->next_out_);
      if (iVar3 == 0) {
        return 0;
      }
      if ((bVar27 | bVar30) == 1) {
        s->stream_state_ = bVar27 + BROTLI_STREAM_FLUSH_REQUESTED;
      }
    }
    CheckFlushComplete(s);
    return 1;
  }
  uVar22 = 1L << ((byte)(s->params).lgwin & 0x3f);
  uVar16 = *available_in;
  uVar5 = uVar22;
  if (uVar16 < uVar22) {
    uVar5 = uVar16;
  }
  sVar29 = 0x20000;
  if (uVar5 < 0x20000) {
    sVar29 = uVar5;
  }
  if (uVar20 == 1) {
    local_70 = s->command_buf_;
    if (uVar5 < 0x20000 || local_70 != (uint32_t *)0x0) {
      if (local_70 != (uint32_t *)0x0) {
        local_68 = s->literal_buf_;
        local_78 = (uint8_t *)0x0;
        local_80 = (uint32_t *)0x0;
        goto LAB_01e1e576;
      }
      if (uVar16 == 0) goto LAB_01e1e54e;
    }
    else {
      puVar8 = (uint32_t *)BrotliAllocate(m,0x80000);
      s->command_buf_ = puVar8;
      local_68 = (uint8_t *)BrotliAllocate(m,0x20000);
      s->literal_buf_ = local_68;
      local_70 = s->command_buf_;
      if (local_70 != (uint32_t *)0x0) goto LAB_01e1e569;
    }
    local_80 = (uint32_t *)BrotliAllocate(m,sVar29 * 4);
    local_78 = (uint8_t *)BrotliAllocate(m,sVar29);
    local_70 = local_80;
    local_68 = local_78;
  }
  else {
LAB_01e1e54e:
    local_68 = (uint8_t *)0x0;
    local_70 = (uint32_t *)0x0;
LAB_01e1e569:
    local_78 = (uint8_t *)0x0;
    local_80 = (uint32_t *)0x0;
  }
LAB_01e1e576:
  local_40 = op - BROTLI_OPERATION_FLUSH;
  local_3c = (op == BROTLI_OPERATION_FINISH) + BROTLI_STREAM_FLUSH_REQUESTED;
LAB_01e1e592:
  do {
    iVar3 = InjectFlushOrPushOutput(s,available_out,next_out,total_out);
  } while (iVar3 != 0);
  if (((s->available_out_ != 0) || (s->stream_state_ != BROTLI_STREAM_PROCESSING)) ||
     (uVar16 = *available_in, op == BROTLI_OPERATION_PROCESS && uVar16 == 0)) {
    BrotliFree(m,local_80);
    BrotliFree(m,local_78);
    CheckFlushComplete(s);
    return 1;
  }
  uVar5 = uVar16;
  if (uVar16 > uVar22) {
    uVar5 = uVar22;
  }
  storage_ix = (size_t)s->last_bytes_bits_;
  BVar4 = BROTLI_STREAM_FLUSH_REQUESTED;
  if (op != BROTLI_OPERATION_FLUSH || uVar16 != 0) goto code_r0x01e1e61e;
  goto LAB_01e1e781;
code_r0x01e1e61e:
  uVar17 = uVar5 * 2 + 0x1f7;
  uVar23 = *available_out;
  if (uVar23 < uVar17) {
    puVar10 = GetBrotliStorage(s,uVar17);
  }
  else {
    puVar10 = *next_out;
  }
  uVar20 = (uint)(op == BROTLI_OPERATION_FINISH && uVar16 <= uVar22);
  *puVar10 = (uint8_t)s->last_bytes_;
  puVar10[1] = *(uint8_t *)((long)&s->last_bytes_ + 1);
  table = GetHashTable(s,(s->params).quality,uVar5,&local_38);
  if ((s->params).quality == 0) {
    BrotliCompressFragmentFast
              (s->one_pass_arena_,*next_in,uVar5,uVar20,table,local_38,&storage_ix,puVar10);
  }
  else {
    BrotliCompressFragmentTwoPass
              (s->two_pass_arena_,*next_in,uVar5,uVar20,local_70,local_68,table,local_38,&storage_ix
               ,puVar10);
  }
  if (uVar16 != 0) {
    *next_in = *next_in + uVar5;
    *available_in = *available_in - uVar5;
    s->total_in_ = s->total_in_ + uVar5;
  }
  uVar5 = storage_ix >> 3;
  if (uVar23 < uVar17) {
    s->next_out_ = puVar10;
    s->available_out_ = uVar5;
  }
  else {
    *next_out = *next_out + uVar5;
    *available_out = *available_out - uVar5;
    uVar18 = s->total_out_ + uVar5;
    s->total_out_ = uVar18;
    if (total_out != (size_t *)0x0) {
      *total_out = uVar18;
    }
  }
  s->last_bytes_ = (ushort)puVar10[uVar5];
  s->last_bytes_bits_ = (byte)storage_ix & 7;
  BVar4 = local_3c;
  if (local_40 < 2 && uVar16 <= uVar22) {
LAB_01e1e781:
    s->stream_state_ = BVar4;
  }
  goto LAB_01e1e592;
}

Assistant:

BROTLI_BOOL duckdb_brotli::BrotliEncoderCompressStream(
    BrotliEncoderState* s, BrotliEncoderOperation op, size_t* available_in,
    const uint8_t** next_in, size_t* available_out, uint8_t** next_out,
    size_t* total_out) {
  if (!EnsureInitialized(s)) return BROTLI_FALSE;

  /* Unfinished metadata block; check requirements. */
  if (s->remaining_metadata_bytes_ != BROTLI_UINT32_MAX) {
    if (*available_in != s->remaining_metadata_bytes_) return BROTLI_FALSE;
    if (op != BROTLI_OPERATION_EMIT_METADATA) return BROTLI_FALSE;
  }

  if (op == BROTLI_OPERATION_EMIT_METADATA) {
    UpdateSizeHint(s, 0);  /* First data metablock might be emitted here. */
    return ProcessMetadata(
        s, available_in, next_in, available_out, next_out, total_out);
  }

  if (s->stream_state_ == BROTLI_STREAM_METADATA_HEAD ||
      s->stream_state_ == BROTLI_STREAM_METADATA_BODY) {
    return BROTLI_FALSE;
  }

  if (s->stream_state_ != BROTLI_STREAM_PROCESSING && *available_in != 0) {
    return BROTLI_FALSE;
  }
  if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY ||
      s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY) {
    return BrotliEncoderCompressStreamFast(s, op, available_in, next_in,
        available_out, next_out, total_out);
  }
  while (BROTLI_TRUE) {
    size_t remaining_block_size = RemainingInputBlockSize(s);
    /* Shorten input to flint size. */
    if (s->flint_ >= 0 && remaining_block_size > (size_t)s->flint_) {
      remaining_block_size = (size_t)s->flint_;
    }

    if (remaining_block_size != 0 && *available_in != 0) {
      size_t copy_input_size =
          BROTLI_MIN(size_t, remaining_block_size, *available_in);
      CopyInputToRingBuffer(s, copy_input_size, *next_in);
      *next_in += copy_input_size;
      *available_in -= copy_input_size;
      s->total_in_ += copy_input_size;
      if (s->flint_ > 0) s->flint_ = (int8_t)(s->flint_ - (int)copy_input_size);
      continue;
    }

    if (InjectFlushOrPushOutput(s, available_out, next_out, total_out)) {
      /* Exit the "emit flint" workflow. */
      if (s->flint_ == BROTLI_FLINT_WAITING_FOR_FLUSHING) {
        CheckFlushComplete(s);
        if (s->stream_state_ == BROTLI_STREAM_PROCESSING) {
          s->flint_ = BROTLI_FLINT_DONE;
        }
      }
      continue;
    }

    /* Compress data only when internal output buffer is empty, stream is not
       finished and there is no pending flush request. */
    if (s->available_out_ == 0 &&
        s->stream_state_ == BROTLI_STREAM_PROCESSING) {
      if (remaining_block_size == 0 || op != BROTLI_OPERATION_PROCESS) {
        BROTLI_BOOL is_last = TO_BROTLI_BOOL(
            (*available_in == 0) && op == BROTLI_OPERATION_FINISH);
        BROTLI_BOOL force_flush = TO_BROTLI_BOOL(
            (*available_in == 0) && op == BROTLI_OPERATION_FLUSH);
        BROTLI_BOOL result;
        /* Force emitting (uncompressed) piece containing flint. */
        if (!is_last && s->flint_ == 0) {
          s->flint_ = BROTLI_FLINT_WAITING_FOR_FLUSHING;
          force_flush = BROTLI_TRUE;
        }
        UpdateSizeHint(s, *available_in);
        result = EncodeData(s, is_last, force_flush,
            &s->available_out_, &s->next_out_);
        if (!result) return BROTLI_FALSE;
        if (force_flush) s->stream_state_ = BROTLI_STREAM_FLUSH_REQUESTED;
        if (is_last) s->stream_state_ = BROTLI_STREAM_FINISHED;
        continue;
      }
    }
    break;
  }
  CheckFlushComplete(s);
  return BROTLI_TRUE;
}